

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

void __thiscall
cmComputeLinkDepends::AddVarLinkEntries(cmComputeLinkDepends *this,int depender_index,char *value)

{
  int iVar1;
  size_t sVar2;
  cmValue cVar3;
  bool bVar4;
  cmTargetLinkLibraryType cVar5;
  bool bVar6;
  pointer name;
  string_view arg;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmLinkItem item;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> actual_libs;
  string var;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deplist;
  undefined1 local_c8 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  sVar2 = strlen(value);
  cVar5 = GENERAL_LibraryType;
  arg._M_str = value;
  arg._M_len = sVar2;
  cmExpandedList_abi_cxx11_(&local_48,arg,false);
  local_88.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar4 = false;
    name = local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar1 = std::__cxx11::string::compare((char *)name);
      bVar6 = true;
      if (iVar1 == 0) {
        cVar5 = DEBUG_LibraryType;
        bVar4 = bVar6;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 == 0) {
          cVar5 = OPTIMIZED_LibraryType;
          bVar4 = bVar6;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)name);
          if (iVar1 != 0) {
            if (name->_M_string_length == 0) goto LAB_004e0ae9;
            if (!bVar4) {
              local_c8._8_8_ = (name->_M_dataplus)._M_p;
              local_c8._0_8_ = name->_M_string_length;
              local_c8._16_8_ = 10;
              local_c8._24_8_ = "_LINK_TYPE";
              views._M_len = 2;
              views._M_array = (iterator)local_c8;
              cmCatViews_abi_cxx11_(&local_68,views);
              cVar3 = cmMakefile::GetDefinition(this->Makefile,&local_68);
              if (cVar3.Value != (string *)0x0) {
                iVar1 = std::__cxx11::string::compare((char *)cVar3.Value);
                if (iVar1 == 0) {
                  cVar5 = DEBUG_LibraryType;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)cVar3.Value);
                  if (iVar1 == 0) {
                    cVar5 = OPTIMIZED_LibraryType;
                  }
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != &local_68.field_2) {
                operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1
                               );
              }
            }
            if ((cVar5 == GENERAL_LibraryType) || (cVar5 == this->LinkType)) {
              ResolveLinkItem((cmLinkItem *)local_c8,this,depender_index,name);
              std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                        (&local_88,(cmLinkItem *)local_c8);
            }
            else {
              cVar5 = GENERAL_LibraryType;
              bVar4 = false;
              if (this->OldLinkDirMode != true) goto LAB_004e0ae9;
              ResolveLinkItem((cmLinkItem *)local_c8,this,depender_index,name);
              CheckWrongConfigItem(this,(cmLinkItem *)local_c8);
            }
            if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
            }
            if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
              operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
            }
            bVar6 = false;
          }
          cVar5 = GENERAL_LibraryType;
          bVar4 = bVar6;
        }
      }
LAB_004e0ae9:
      name = name + 1;
    } while (name != local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  }
  AddLinkEntries<cmLinkItem>(this,depender_index,&local_88);
  std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector(&local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void cmComputeLinkDepends::AddVarLinkEntries(int depender_index,
                                             const char* value)
{
  // This is called to add the dependencies named by
  // <item>_LIB_DEPENDS.  The variable contains a semicolon-separated
  // list.  The list contains link-type;item pairs and just items.
  std::vector<std::string> deplist = cmExpandedList(value);

  // Look for entries meant for this configuration.
  std::vector<cmLinkItem> actual_libs;
  cmTargetLinkLibraryType llt = GENERAL_LibraryType;
  bool haveLLT = false;
  for (std::string const& d : deplist) {
    if (d == "debug") {
      llt = DEBUG_LibraryType;
      haveLLT = true;
    } else if (d == "optimized") {
      llt = OPTIMIZED_LibraryType;
      haveLLT = true;
    } else if (d == "general") {
      llt = GENERAL_LibraryType;
      haveLLT = true;
    } else if (!d.empty()) {
      // If no explicit link type was given prior to this entry then
      // check if the entry has its own link type variable.  This is
      // needed for compatibility with dependency files generated by
      // the export_library_dependencies command from CMake 2.4 and
      // lower.
      if (!haveLLT) {
        std::string var = cmStrCat(d, "_LINK_TYPE");
        if (cmValue val = this->Makefile->GetDefinition(var)) {
          if (*val == "debug") {
            llt = DEBUG_LibraryType;
          } else if (*val == "optimized") {
            llt = OPTIMIZED_LibraryType;
          }
        }
      }

      // If the library is meant for this link type then use it.
      if (llt == GENERAL_LibraryType || llt == this->LinkType) {
        actual_libs.emplace_back(this->ResolveLinkItem(depender_index, d));
      } else if (this->OldLinkDirMode) {
        cmLinkItem item = this->ResolveLinkItem(depender_index, d);
        this->CheckWrongConfigItem(item);
      }

      // Reset the link type until another explicit type is given.
      llt = GENERAL_LibraryType;
      haveLLT = false;
    }
  }

  // Add the entries from this list.
  this->AddLinkEntries(depender_index, actual_libs);
}